

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjIsRo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  undefined1 local_19;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCi(pObj);
  local_19 = false;
  if (iVar1 != 0) {
    iVar1 = Gia_ObjCioId(pObj);
    iVar2 = Gia_ManPiNum(p);
    local_19 = iVar2 <= iVar1;
  }
  return (int)local_19;
}

Assistant:

static inline int          Gia_ObjIsRo( Gia_Man_t * p, Gia_Obj_t * pObj )      { return Gia_ObjIsCi(pObj) && Gia_ObjCioId(pObj) >= Gia_ManPiNum(p);  }